

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

bool __thiscall AddressFilter::IsInList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *pIVar1;
  IPAsKey key;
  
  IPAsKey::IPAsKey((IPAsKey *)&stack0xffffffffffffffc0,addr,len);
  pIVar1 = BinHash<IPAsKey>::Retrieve(&this->table,(IPAsKey *)&stack0xffffffffffffffc0);
  IPAsKeyLRU::~IPAsKeyLRU((IPAsKeyLRU *)&stack0xffffffffffffffc0);
  return pIVar1 != (IPAsKey *)0x0;
}

Assistant:

bool AddressFilter::IsInList(uint8_t * addr, size_t len)
{
    IPAsKey key(addr, len);
    IPAsKey * ret = table.Retrieve(&key);

    return (ret != NULL);
}